

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void perfetto::DataSource<perfetto::TrackEvent,_perfetto::internal::TrackEventDataSourceTraits>::
     CreateDataSourceCustomTLSImpl<perfetto::internal::TrackEventTlsState>
               (TraceContext *trace_context,TrackEventTlsState *param_2)

{
  TrackEventTlsState *this;
  _lambda_void___1_ local_41;
  _func_void_void_ptr *local_40 [3];
  unique_ptr<void,_void_(*)(void_*)> local_28;
  TrackEventTlsState *local_18;
  TrackEventTlsState *param_1_local;
  TraceContext *trace_context_local;
  
  local_18 = param_2;
  param_1_local = (TrackEventTlsState *)trace_context;
  this = (TrackEventTlsState *)operator_new(0x18);
  internal::TrackEventTlsState::
  TrackEventTlsState<perfetto::DataSource<perfetto::TrackEvent,perfetto::internal::TrackEventDataSourceTraits>::TraceContext>
            (this,(TraceContext *)param_1_local);
  local_40[0] = perfetto::DataSource::
                CreateDataSourceCustomTLSImpl(perfetto::DataSource::TraceContext_const&,perfetto::internal::TrackEventTlsState_const*)
                ::{lambda(void*)#1}::operator_cast_to_function_pointer(&local_41);
  ::std::unique_ptr<void,void(*)(void*)>::unique_ptr<void(*)(void*),void>
            ((unique_ptr<void,void(*)(void*)> *)&local_28,this,local_40);
  ::std::unique_ptr<void,_void_(*)(void_*)>::operator=
            ((unique_ptr<void,_void_(*)(void_*)> *)(*(long *)param_1_local + 0x18),&local_28);
  ::std::unique_ptr<void,_void_(*)(void_*)>::~unique_ptr(&local_28);
  return;
}

Assistant:

static void CreateDataSourceCustomTLSImpl(const TraceContext& trace_context,
                                            const T*) {
    PERFETTO_DCHECK(!trace_context.tls_inst_->data_source_custom_tls);
    trace_context.tls_inst_->data_source_custom_tls =
        internal::DataSourceInstanceThreadLocalState::ObjectWithDeleter(
            reinterpret_cast<void*>(new T(trace_context)),
            [](void* p) { delete reinterpret_cast<T*>(p); });
  }